

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cc
# Opt level: O1

void __thiscall gimage::View::setDepthImage(View *this,ImageFloat *d)

{
  long lVar1;
  Camera *pCVar2;
  long lVar3;
  
  Image<float,_gimage::PixelTraits<float>_>::setSize(&this->depth,d->width,d->height,(long)d->depth)
  ;
  lVar1 = (this->depth).n;
  lVar3 = -lVar1;
  if (0 < lVar1) {
    lVar3 = lVar1;
  }
  memcpy((this->depth).pixel,d->pixel,lVar3 << 2);
  pCVar2 = this->camera;
  if (((pCVar2 != (Camera *)0x0) && (*(long *)(pCVar2 + 0x28) == 0)) &&
     (*(long *)(pCVar2 + 0x30) == 0)) {
    lVar1 = (this->depth).height;
    *(long *)(pCVar2 + 0x28) = (this->depth).width;
    *(long *)(pCVar2 + 0x30) = lVar1;
  }
  return;
}

Assistant:

void View::setDepthImage(const ImageFloat &d)
{
  // make sure that the size of the camera is the same as the size of the
  // images

  if (camera != 0 && camera->getWidth() > 0 && camera->getHeight() > 0)
  {
    assert(camera->getWidth() == d.getWidth());
    assert(camera->getHeight() == d.getHeight());
  }

  if (image.getWidth() > 0 && image.getHeight() > 0)
  {
    assert(d.getWidth() == image.getWidth());
    assert(d.getHeight() == image.getHeight());
  }

  depth=d;

  // set size of camera from images if neccessary

  if (camera != 0 && camera->getWidth() == 0 && camera->getHeight() == 0)
  {
    camera->setSize(depth.getWidth(), depth.getHeight());
  }
}